

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O1

void depspawn::set_threads(int nthreads)

{
  TaskPool *pTVar1;
  int iVar2;
  
  pTVar1 = internal::TP;
  if (internal::TP != (TaskPool *)0x0) {
    if (internal::TP != (TaskPool *)0x0) {
      internal::TaskPool::~TaskPool(internal::TP);
      operator_delete(pTVar1);
    }
    internal::TP = (TaskPool *)0x0;
  }
  if (nthreads < 0) {
    iVar2 = std::thread::hardware_concurrency();
    nthreads = nthreads + iVar2 + 1;
  }
  internal::Nthreads = nthreads;
  if (internal::FAST_THRESHOLD_ExplicitlySet == '\0') {
    internal::FAST_THRESHOLD = nthreads * 2;
  }
  return;
}

Assistant:

void set_threads(int nthreads)
  {
#ifdef DEPSPAWN_USE_TBB
    tbb_set_threads(nthreads);
    if (nthreads == -1) {
      nthreads = std::thread::hardware_concurrency(); //Reasonable estimation
    }
#else
    if (TP != nullptr) {
      delete TP; // implies TP->wait(false)
      TP = nullptr;
    }
    
//    TP = new TaskPool((nthreads < 0) ? nthreads : (nthreads - 1), false);
//    assert(TP != nullptr);
//    nthreads = TP->nthreads() + 1;
    nthreads = ((nthreads < 0) ? (std::thread::hardware_concurrency() + nthreads) : (nthreads - 1)) + 1;
#endif

    Nthreads = nthreads;
    
#ifdef DEPSPAWN_FAST_START
    if (!FAST_THRESHOLD_ExplicitlySet) {
      FAST_THRESHOLD = 2 * nthreads; //Heuristic
    }
#endif
  }